

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes.cpp
# Opt level: O2

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
* nivalis::OpCode::funcname_to_opcode_map_abi_cxx11_(void)

{
  int iVar1;
  long lVar2;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  allocator_type local_912;
  less<void> local_911;
  int local_910 [52];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_840;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_818;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_7f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_7c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_7a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_778;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_750;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_728;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_700;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_6d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_6b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_688;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_660;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_638;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_610;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_5e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_5c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_598;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_570;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_548;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_520;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_4f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_4d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_4a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_480;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_458;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_430;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_408;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_3e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_3b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_390;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_368;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_340;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_318;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_2f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_2c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_2a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_278;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_250;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_228;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_200;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_1d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_1b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_188;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_160;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_138;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_110;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_98;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_70;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_48;
  
  if (funcname_to_opcode_map[abi:cxx11]()::func_opcodes_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&funcname_to_opcode_map[abi:cxx11]()::func_opcodes_abi_cxx11_);
    if (iVar1 != 0) {
      local_910[0x33] = 0x32;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (&local_840,(char (*) [4])"mod",(_OpCode *)(local_910 + 0x33));
      local_910[0x32] = 0x40;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (&local_818,(char (*) [4])"pow",(_OpCode *)(local_910 + 0x32));
      local_910[0x31] = 0x41;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (&local_7f0,(char (*) [4])"log",(_OpCode *)(local_910 + 0x31));
      local_910[0x30] = 0x50;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (&local_7c8,(char (*) [4])"max",(_OpCode *)(local_910 + 0x30));
      local_910[0x2f] = 0x51;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (&local_7a0,(char (*) [4])"min",(_OpCode *)(local_910 + 0x2f));
      local_910[0x2e] = 0x54;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (&local_778,(char (*) [4])"xor",(_OpCode *)(local_910 + 0x2e));
      local_910[0x2d] = 0x8001;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (&local_750,(char (*) [4])"not",(_OpCode *)(local_910 + 0x2d));
      local_910[0x2c] = 0x52;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (&local_728,(char (*) [4])"and",(_OpCode *)(local_910 + 0x2c));
      local_910[0x2b] = 0x53;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[3],_nivalis::OpCode::_OpCode,_true>
                (&local_700,(char (*) [3])0x11eaee,(_OpCode *)(local_910 + 0x2b));
      local_910[0x2a] = 0x8002;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (&local_6d8,(char (*) [4])"abs",(_OpCode *)(local_910 + 0x2a));
      local_910[0x29] = 0x8003;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[5],_nivalis::OpCode::_OpCode,_true>
                (&local_6b0,(char (*) [5])"sqrt",(_OpCode *)(local_910 + 0x29));
      local_910[0x28] = 0x8005;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (&local_688,(char (*) [4])"sgn",(_OpCode *)(local_910 + 0x28));
      local_910[0x27] = 0x8006;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[6],_nivalis::OpCode::_OpCode,_true>
                (&local_660,(char (*) [6])"floor",(_OpCode *)(local_910 + 0x27));
      local_910[0x26] = 0x8007;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[5],_nivalis::OpCode::_OpCode,_true>
                (&local_638,(char (*) [5])"ceil",(_OpCode *)(local_910 + 0x26));
      local_910[0x25] = 0x8008;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[6],_nivalis::OpCode::_OpCode,_true>
                (&local_610,(char (*) [6])"round",(_OpCode *)(local_910 + 0x25));
      local_910[0x24] = 0x8009;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (&local_5e8,(char (*) [4])"exp",(_OpCode *)(local_910 + 0x24));
      local_910[0x23] = 0x800a;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[5],_nivalis::OpCode::_OpCode,_true>
                (&local_5c0,(char (*) [5])"exp2",(_OpCode *)(local_910 + 0x23));
      local_910[0x22] = 0x800b;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[3],_nivalis::OpCode::_OpCode,_true>
                (&local_598,(char (*) [3])"ln",(_OpCode *)(local_910 + 0x22));
      local_910[0x21] = 0x800c;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[6],_nivalis::OpCode::_OpCode,_true>
                (&local_570,(char (*) [6])"log10",(_OpCode *)(local_910 + 0x21));
      local_910[0x20] = 0x800d;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[5],_nivalis::OpCode::_OpCode,_true>
                (&local_548,(char (*) [5])"log2",(_OpCode *)(local_910 + 0x20));
      local_910[0x1f] = 0x800f;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (&local_520,(char (*) [4])0x11eb16,(_OpCode *)(local_910 + 0x1f));
      local_910[0x1e] = 0x8010;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (&local_4f8,(char (*) [4])0x11eb1d,(_OpCode *)(local_910 + 0x1e));
      local_910[0x1d] = 0x8011;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (&local_4d0,(char (*) [4])0x11eb24,(_OpCode *)(local_910 + 0x1d));
      local_910[0x1c] = 0x8012;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[7],_nivalis::OpCode::_OpCode,_true>
                (&local_4a8,(char (*) [7])"arcsin",(_OpCode *)(local_910 + 0x1c));
      local_910[0x1b] = 0x8013;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[7],_nivalis::OpCode::_OpCode,_true>
                (&local_480,(char (*) [7])"arccos",(_OpCode *)(local_910 + 0x1b));
      local_910[0x1a] = 0x8014;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[7],_nivalis::OpCode::_OpCode,_true>
                (&local_458,(char (*) [7])"arctan",(_OpCode *)(local_910 + 0x1a));
      local_910[0x19] = 0x8015;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[5],_nivalis::OpCode::_OpCode,_true>
                (&local_430,(char (*) [5])"sinh",(_OpCode *)(local_910 + 0x19));
      local_910[0x18] = 0x8016;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[5],_nivalis::OpCode::_OpCode,_true>
                (&local_408,(char (*) [5])"cosh",(_OpCode *)(local_910 + 0x18));
      local_910[0x17] = 0x8017;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[5],_nivalis::OpCode::_OpCode,_true>
                (&local_3e0,(char (*) [5])"tanh",(_OpCode *)(local_910 + 0x17));
      local_910[0x16] = 0x8018;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[6],_nivalis::OpCode::_OpCode,_true>
                (&local_3b8,(char (*) [6])0x11eb46,(_OpCode *)(local_910 + 0x16));
      local_910[0x15] = 0x8018;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[6],_nivalis::OpCode::_OpCode,_true>
                (&local_390,(char (*) [6])"Gamma",(_OpCode *)(local_910 + 0x15));
      local_910[0x14] = 0x800e;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[6],_nivalis::OpCode::_OpCode,_true>
                (&local_368,(char (*) [6])0x11eb92,(_OpCode *)(local_910 + 0x14));
      local_910[0x13] = 0x8019;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[7],_nivalis::OpCode::_OpCode,_true>
                (&local_340,(char (*) [7])"lgamma",(_OpCode *)(local_910 + 0x13));
      local_910[0x12] = 0x801a;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[8],_nivalis::OpCode::_OpCode,_true>
                (&local_318,(char (*) [8])"digamma",(_OpCode *)(local_910 + 0x12));
      local_910[0x11] = 0x801a;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[6],_nivalis::OpCode::_OpCode,_true>
                (&local_2f0,(char (*) [6])"psi_0",(_OpCode *)(local_910 + 0x11));
      local_910[0x10] = 0x801b;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[9],_nivalis::OpCode::_OpCode,_true>
                (&local_2c8,(char (*) [9])"trigamma",(_OpCode *)(local_910 + 0x10));
      local_910[0xf] = 0x801b;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[6],_nivalis::OpCode::_OpCode,_true>
                (&local_2a0,(char (*) [6])"psi_1",(_OpCode *)(local_910 + 0xf));
      local_910[0xe] = 0x4006;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[10],_nivalis::OpCode::_OpCode,_true>
                (&local_278,(char (*) [10])"polygamma",(_OpCode *)(local_910 + 0xe));
      local_910[0xd] = 0x801c;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (&local_250,(char (*) [4])"erf",(_OpCode *)(local_910 + 0xd));
      local_910[0xc] = 0x801d;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[5],_nivalis::OpCode::_OpCode,_true>
                (&local_228,(char (*) [5])"zeta",(_OpCode *)(local_910 + 0xc));
      local_910[0xb] = 0x4005;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[5],_nivalis::OpCode::_OpCode,_true>
                (&local_200,(char (*) [5])"beta",(_OpCode *)(local_910 + 0xb));
      local_910[10] = 0x4005;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[2],_nivalis::OpCode::_OpCode,_true>
                (&local_1d8,(char (*) [2])"B",(_OpCode *)(local_910 + 10));
      local_910[9] = 0x4000;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (&local_1b0,(char (*) [4])"gcd",(_OpCode *)(local_910 + 9));
      local_910[8] = 0x4001;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (&local_188,(char (*) [4])"lcm",(_OpCode *)(local_910 + 8));
      local_910[7] = 0x4002;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[7],_nivalis::OpCode::_OpCode,_true>
                (&local_160,(char (*) [7])"choose",(_OpCode *)(local_910 + 7));
      local_910[6] = 0x4003;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[7],_nivalis::OpCode::_OpCode,_true>
                (&local_138,(char (*) [7])"fafact",(_OpCode *)(local_910 + 6));
      local_910[5] = 0x4004;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[7],_nivalis::OpCode::_OpCode,_true>
                (&local_110,(char (*) [7])"rifact",(_OpCode *)(local_910 + 5));
      local_910[4] = 0x801f;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[9],_nivalis::OpCode::_OpCode,_true>
                (&local_e8,(char (*) [9])"softplus",(_OpCode *)(local_910 + 4));
      local_910[3] = 0x801e;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[8],_nivalis::OpCode::_OpCode,_true>
                (&local_c0,(char (*) [8])"sigmoid",(_OpCode *)(local_910 + 3));
      local_910[2] = 0x8020;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[9],_nivalis::OpCode::_OpCode,_true>
                (&local_98,(char (*) [9])"gausspdf",(_OpCode *)(local_910 + 2));
      local_910[1] = 0xffffffff;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[5],_int,_true>(&local_70,(char (*) [5])0x11eb8c,local_910 + 1);
      local_910[0] = -1;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[2],_int,_true>(&local_48,(char (*) [2])"N",local_910);
      __l._M_len = 0x34;
      __l._M_array = &local_840;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ::map(&funcname_to_opcode_map[abi:cxx11]()::func_opcodes_abi_cxx11_,__l,&local_911,&local_912)
      ;
      lVar2 = 0x7f8;
      do {
        std::__cxx11::string::~string((string *)((long)&local_840.first._M_dataplus._M_p + lVar2));
        lVar2 = lVar2 + -0x28;
      } while (lVar2 != -0x28);
      __cxa_atexit(std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   ::~map,&funcname_to_opcode_map[abi:cxx11]()::func_opcodes_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&funcname_to_opcode_map[abi:cxx11]()::func_opcodes_abi_cxx11_);
    }
  }
  return &funcname_to_opcode_map[abi:cxx11]()::func_opcodes_abi_cxx11_;
}

Assistant:

const std::map<std::string, uint32_t, std::less<> >& funcname_to_opcode_map() {
    static std::map<std::string, uint32_t, std::less<> > func_opcodes = {
        {"mod", OpCode::mod},
        {"pow", OpCode::power},
        {"log", OpCode::logbase},
        {"max", OpCode::max},
        {"min", OpCode::min},
        {"xor", OpCode::lxor},
        {"not", OpCode::lnot},
        {"and", OpCode::land},
        {"or", OpCode::lor},

        {"abs", OpCode::absb},
        {"sqrt", OpCode::sqrtb},
        {"sgn", OpCode::sgn},
        {"floor", OpCode::floorb},
        {"ceil", OpCode::ceilb},
        {"round", OpCode::roundb},

        {"exp", OpCode::expb},
        {"exp2", OpCode::exp2b},
        {"ln", OpCode::logb},
        {"log10", OpCode::log10b},
        {"log2", OpCode::log2b},

        {"sin", OpCode::sinb},
        {"cos", OpCode::cosb},
        {"tan", OpCode::tanb},
        {"arcsin", OpCode::asinb},
        {"arccos", OpCode::acosb},
        {"arctan", OpCode::atanb},

        {"sinh", OpCode::sinhb},
        {"cosh", OpCode::coshb},
        {"tanh", OpCode::tanhb},

        {"gamma", OpCode::tgammab},
        {"Gamma", OpCode::tgammab},
        {"ifact", OpCode::factb},
        {"lgamma", OpCode::lgammab},
        {"digamma", OpCode::digammab},
        {"psi_0", OpCode::digammab},
        {"trigamma", OpCode::trigammab},
        {"psi_1", OpCode::trigammab},
        {"polygamma", OpCode::polygammab},
        {"erf", OpCode::erfb},
        {"zeta", OpCode::zetab},
        {"beta", OpCode::betab},
        {"B", OpCode::betab},
        {"gcd", OpCode::gcd},
        {"lcm", OpCode::lcm},
        {"choose", OpCode::choose},
        {"fafact", OpCode::fafact},
        {"rifact", OpCode::rifact},
        {"softplus", OpCode::softplusb},
        {"sigmoid", OpCode::sigmoidb},
        {"gausspdf", OpCode::gausspdfb},

        // -1 means fake command handled in parser
        {"fact", -1},
        {"N", -1}, // standard normal
    };
    return func_opcodes;
}